

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

bool cs::compiler_type::find_id_ref(iterator it,string *id)

{
  token_base *ptVar1;
  _func_int **pp_Var2;
  __type _Var3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  token_base **pptVar7;
  iterator iVar8;
  size_t sVar9;
  _func_int **pp_Var10;
  tree_type<cs::token_base_*> *tree;
  _func_int **pp_Var11;
  iterator local_38;
  
  if (it.mData != (tree_node *)0x0) {
    local_38.mData = it.mData;
    pptVar7 = tree_type<cs::token_base_*>::iterator::data(&local_38);
    ptVar1 = *pptVar7;
    if (ptVar1 != (token_base *)0x0) {
      iVar6 = (*ptVar1->_vptr_token_base[2])(ptVar1);
      if (iVar6 == 0xe) {
        pp_Var11 = ptVar1[2]._vptr_token_base;
        pp_Var10 = ptVar1[3]._vptr_token_base;
        sVar9 = ptVar1[3].line_num;
        pp_Var2 = ptVar1[4]._vptr_token_base;
        while( true ) {
          bVar5 = pp_Var11 != pp_Var2;
          if (!bVar5) {
            return bVar5;
          }
          bVar4 = find_id_ref((tree_node *)*pp_Var11,id);
          if (bVar4) break;
          pp_Var11 = pp_Var11 + 1;
          if (pp_Var11 == pp_Var10) {
            pp_Var11 = *(_func_int ***)(sVar9 + 8);
            sVar9 = sVar9 + 8;
            pp_Var10 = pp_Var11 + 0x40;
          }
        }
        return bVar5;
      }
      if (iVar6 == 0xc) {
        pptVar7 = tree_type<cs::token_base_*>::iterator::data(&local_38);
        iVar8.mData = (tree_node *)(*pptVar7)[1]._vptr_token_base;
      }
      else {
        if (iVar6 == 4) {
          _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(ptVar1 + 3),id);
          return _Var3;
        }
        iVar8 = tree_type<cs::token_base_*>::iterator::left(&local_38);
        bVar5 = find_id_ref(iVar8,id);
        if (bVar5) {
          return true;
        }
        iVar8 = tree_type<cs::token_base_*>::iterator::right(&local_38);
      }
      bVar5 = find_id_ref(iVar8,id);
      return bVar5;
    }
  }
  return false;
}

Assistant:

bool compiler_type::find_id_ref(tree_type<token_base *>::iterator it, const std::string &id)
	{
		if (!it.usable())
			return false;
		token_base *token = it.data();
		if (token == nullptr)
			return false;
		switch (token->get_type()) {
		default:
			break;
		case token_types::id:
			return static_cast<token_id *>(token)->get_id().get_id() == id;
		case token_types::expr:
			return find_id_ref(static_cast<token_expr *>(it.data())->get_tree().root(), id);
		case token_types::array: {
			for (auto &tree: static_cast<token_array *>(token)->get_array()) {
				if (find_id_ref(tree.root(), id))
					return true;
			}
			return false;
		}
		}
		if (find_id_ref(it.left(), id) || find_id_ref(it.right(), id))
			return true;
		else
			return false;
	}